

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O3

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::PhysicalTableScan::ExtraSourceParams_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PhysicalTableScan *this,GlobalSourceState *gstate_p,
          LocalSourceState *lstate)

{
  table_function_dynamic_to_string_t p_Var1;
  TableFunctionDynamicToStringInput input;
  TableFunctionDynamicToStringInput local_28;
  
  p_Var1 = (this->function).dynamic_to_string;
  if (p_Var1 == (table_function_dynamic_to_string_t)0x0) {
    (__return_storage_ptr__->map).
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->map).
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->map).
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->map_idx)._M_h._M_buckets =
         &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
    (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
    (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
    (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  }
  else {
    local_28.bind_data.ptr =
         (this->bind_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    local_28.table_function = &this->function;
    local_28.local_state.ptr = (LocalTableFunctionState *)lstate[1]._vptr_LocalSourceState;
    local_28.global_state.ptr =
         *(GlobalTableFunctionState **)&gstate_p[1].super_StateWithBlockableTasks;
    (*p_Var1)(__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

InsertionOrderPreservingMap<string> PhysicalTableScan::ExtraSourceParams(GlobalSourceState &gstate_p,
                                                                         LocalSourceState &lstate) const {
	if (!function.dynamic_to_string) {
		return InsertionOrderPreservingMap<string>();
	}
	auto &gstate = gstate_p.Cast<TableScanGlobalSourceState>();
	auto &state = lstate.Cast<TableScanLocalSourceState>();
	TableFunctionDynamicToStringInput input(function, bind_data.get(), state.local_state.get(),
	                                        gstate.global_state.get());
	return function.dynamic_to_string(input);
}